

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

Mutex * __thiscall
el::LogDispatchCallback::fileHandle(LogDispatchCallback *this,LogDispatchData *data)

{
  Level level;
  LogMessage *pLVar1;
  Logger *this_00;
  TypedConfigurations *this_01;
  string *__x;
  pointer ppVar2;
  pointer pNVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>,_true>
  local_20;
  iterator it;
  LogDispatchData *data_local;
  LogDispatchCallback *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>,_true>
               )data;
  pLVar1 = LogDispatchData::logMessage(data);
  this_00 = LogMessage::logger(pLVar1);
  this_01 = Logger::typedConfigurations(this_00);
  pLVar1 = LogDispatchData::logMessage
                     ((LogDispatchData *)
                      it.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>,_true>
                      ._M_cur);
  level = LogMessage::level(pLVar1);
  __x = el::base::TypedConfigurations::filename_abi_cxx11_(this_01,level);
  local_20._M_cur =
       (__node_type *)
       el::base::utils::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>_>_>
       ::find(&this->m_fileLocks,__x);
  ppVar2 = el::base::utils::std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>_>,_false,_true>
                         *)&local_20);
  pNVar3 = el::base::utils::std::
           unique_ptr<el::base::threading::internal::NoMutex,_std::default_delete<el::base::threading::internal::NoMutex>_>
           ::get(&ppVar2->second);
  return pNVar3;
}

Assistant:

base::threading::Mutex& LogDispatchCallback::fileHandle(const LogDispatchData* data) {
  auto it = m_fileLocks.find(data->logMessage()->logger()->typedConfigurations()->filename(data->logMessage()->level()));
  return *(it->second.get());
}